

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

int __thiscall gvr::PLYWriter::close(PLYWriter *this,int __fd)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppPVar4;
  long lVar5;
  undefined8 uVar6;
  bool bVar7;
  PLYWriter *in_stack_00000050;
  string *in_stack_ffffffffffffffc8;
  IOException *in_stack_ffffffffffffffd0;
  string local_28 [32];
  PLYWriter *local_8;
  
  local_8 = this;
  if ((this->header_complete & 1U) == 0) {
    writeHeader(in_stack_00000050);
  }
  uVar2 = std::ofstream::is_open();
  if ((uVar2 & 1) != 0) {
    std::ofstream::close();
    this->pelem = this->pelem + 1;
    while( true ) {
      uVar2 = this->pelem;
      sVar3 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size(&this->list);
      bVar7 = false;
      if (uVar2 < sVar3) {
        ppPVar4 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                            (&this->list,this->pelem);
        lVar5 = PLYElement::getInstances(*ppPVar4);
        bVar7 = true;
        if (0 < lVar5) {
          std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                    (&this->list,this->pelem);
          iVar1 = PLYElement::getPropertyCount((PLYElement *)0x14713c);
          bVar7 = iVar1 == 0;
        }
      }
      if (!bVar7) break;
      this->pelem = this->pelem + 1;
    }
    if (((this->plist == 0) && (this->pprop == 1)) && (this->pinst == 1)) {
      uVar2 = this->pelem;
      sVar3 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size(&this->list);
      if (sVar3 <= uVar2) goto LAB_00147268;
    }
    uVar6 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_28,
               "All data as specified in the header must be written. The ply file is corrupted!",
               (allocator *)&stack0xffffffffffffffd7);
    gutil::IOException::IOException(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    __cxa_throw(uVar6,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
LAB_00147268:
  return (int)uVar2;
}

Assistant:

void PLYWriter::close()
{
  if (!header_complete)
  {
    writeHeader();
  }

  if (out.is_open())
  {
    out.close();

    pelem++;

    while (pelem < list.size() && (list[pelem]->getInstances() <= 0 ||
                                   list[pelem]->getPropertyCount() == 0))
    {
      pelem++;
    }

    if (!(plist == 0 && pprop == 1 && pinst == 1 && pelem >= list.size()))
    {
      throw gutil::IOException("All data as specified in the header must be written. The ply file is corrupted!");
    }
  }
}